

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  Expr *p;
  Table *pTVar1;
  Window *pWVar2;
  bool bVar3;
  int iVar4;
  ExprList *pEVar5;
  Window **ppWVar6;
  int iVar7;
  ExprList_item *pEVar8;
  ExprList_item *pEVar9;
  long lVar10;
  int iCol;
  int local_60;
  uint local_5c;
  Parse *local_58;
  Window **local_50;
  char *local_48;
  NameContext *local_40;
  Expr *local_38;
  
  if (pOrderBy == (ExprList *)0x0) {
    return 0;
  }
  local_58 = pNC->pParse;
  local_40 = pNC;
  if (0 < pOrderBy->nExpr) {
    local_5c = pSelect->pEList->nExpr;
    pEVar8 = pOrderBy->a;
    local_50 = &pSelect->pWin;
    iVar7 = 0;
    local_48 = zType;
    local_38 = (Expr *)pOrderBy;
    do {
      pExpr = pEVar8->pExpr;
      p = pExpr;
      while ((p != (Expr *)0x0 && ((p->flags >> 0xc & 1) != 0))) {
        if ((p->flags >> 0x12 & 1) == 0) {
          pEVar9 = (ExprList_item *)&p->pLeft;
        }
        else {
          pEVar9 = ((p->x).pList)->a;
        }
        p = pEVar9->pExpr;
      }
      if ((*zType == 'G') ||
         (local_60 = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,local_38), local_60 < 1))
      {
        iVar4 = sqlite3ExprIsInteger(p,&local_60);
        if (iVar4 == 0) {
          (pEVar8->u).x.iOrderByCol = 0;
          iVar4 = sqlite3ResolveExprNames(local_40,pExpr);
          bVar3 = true;
          if (iVar4 == 0) {
            pEVar5 = pSelect->pEList;
            bVar3 = false;
            if (0 < pEVar5->nExpr) {
              lVar10 = 0;
              do {
                iVar4 = sqlite3ExprCompare((Parse *)0x0,pExpr,pEVar5->a[lVar10].pExpr,-1);
                if (iVar4 == 0) {
                  if ((pExpr->flags & 0x1000000) != 0) {
                    pTVar1 = (Table *)*local_50;
                    ppWVar6 = local_50;
                    while (pTVar1 != (Table *)0x0) {
                      if (pTVar1 == (pExpr->y).pTab) {
                        *ppWVar6 = (Window *)pTVar1->pCheck;
                      }
                      pWVar2 = *ppWVar6;
                      ppWVar6 = &pWVar2->pNextWin;
                      pTVar1 = (Table *)pWVar2->pNextWin;
                    }
                  }
                  (pEVar8->u).x.iOrderByCol = (short)lVar10 + 1;
                }
                lVar10 = lVar10 + 1;
                pEVar5 = pSelect->pEList;
                zType = local_48;
              } while (lVar10 < pEVar5->nExpr);
            }
          }
        }
        else {
          if (0xffff0000 < local_60 - 0x10000U) {
            (pEVar8->u).x.iOrderByCol = (u16)local_60;
            goto LAB_0015b4e1;
          }
          sqlite3ErrorMsg(local_58,"%r %s BY term out of range - should be between 1 and %d",
                          (ulong)(iVar7 + 1),zType,(ulong)local_5c);
          bVar3 = true;
        }
      }
      else {
        (pEVar8->u).x.iOrderByCol = (u16)local_60;
LAB_0015b4e1:
        bVar3 = false;
      }
      if (bVar3) {
        return 1;
      }
      iVar7 = iVar7 + 1;
      pEVar8 = pEVar8 + 1;
      iVar4._0_1_ = local_38->op;
      iVar4._1_1_ = local_38->affinity;
      iVar4._2_2_ = *(undefined2 *)&local_38->field_0x2;
      pOrderBy = (ExprList *)local_38;
    } while (iVar7 < iVar4);
  }
  iVar7 = sqlite3ResolveOrderGroupBy(local_58,pSelect,pOrderBy,zType);
  return iVar7;
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollate(pE);
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( ExprHasProperty(pE, EP_WinFunc) ){
          /* Since this window function is being changed into a reference
          ** to the same window function the result set, remove the instance
          ** of this window function from the Select.pWin list. */
          Window **pp;
          for(pp=&pSelect->pWin; *pp; pp=&(*pp)->pNextWin){
            if( *pp==pE->y.pWin ){
              *pp = (*pp)->pNextWin;
            }    
          }
        }
#endif
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}